

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_unit.c
# Opt level: O0

void zt_unit_release(zt_unit **unit)

{
  long *in_RDI;
  zt_unit_suite *tsuite;
  zt_elist_t *tmp;
  zt_elist_t *ignore;
  zt_unit_suite **local_18;
  zt_unit_suite *suite;
  
  local_18 = *(zt_unit_suite ***)(*in_RDI + 8);
  suite = local_18[1];
  while (local_18 != (zt_unit_suite **)*in_RDI) {
    local_18 = (zt_unit_suite **)suite;
    zt_unit_release_suite((zt_unit_suite **)suite);
    suite = local_18[1];
  }
  if (*in_RDI != 0) {
    free((void *)*in_RDI);
    *in_RDI = 0;
  }
  *in_RDI = 0;
  return;
}

Assistant:

void
zt_unit_release(struct zt_unit **unit)
{
    zt_elist_t * ignore;
    zt_elist_t * tmp;

    zt_assert(unit);
    zt_assert(*unit);

    zt_elist_for_each_safe(&(*unit)->suites, tmp, ignore) {
        struct zt_unit_suite * tsuite = zt_elist_data(tmp, struct zt_unit_suite, suite);

        zt_unit_release_suite(&tsuite);
    }

    zt_free(*unit);
    *unit = NULL;
}